

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setWindowRole(QWidget *this,QString *role)

{
  QTLWExtra *pQVar1;
  QWindow *pQVar2;
  long lVar3;
  long *plVar4;
  QString *in_RSI;
  QXcbWindow *xcbWindow;
  QWidgetPrivate *d;
  QWidgetPrivate *in_stack_ffffffffffffffc0;
  QWidgetPrivate *in_stack_ffffffffffffffc8;
  
  d_func((QWidget *)0x372631);
  QWidgetPrivate::createTLExtra(in_stack_ffffffffffffffc8);
  pQVar1 = QWidgetPrivate::topData(in_stack_ffffffffffffffc0);
  QString::operator=(&pQVar1->role,in_RSI);
  pQVar2 = windowHandle((QWidget *)in_stack_ffffffffffffffc0);
  if (pQVar2 != (QWindow *)0x0) {
    windowHandle((QWidget *)in_stack_ffffffffffffffc0);
    lVar3 = QWindow::handle();
    if (lVar3 == 0) {
      plVar4 = (long *)0x0;
    }
    else {
      plVar4 = (long *)__dynamic_cast(lVar3,&QPlatformWindow::typeinfo,
                                      &QNativeInterface::Private::QXcbWindow::typeinfo,
                                      0xfffffffffffffffe);
    }
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x18))(plVar4,in_RSI);
    }
  }
  return;
}

Assistant:

void QWidget::setWindowRole(const QString &role)
{
#if QT_CONFIG(xcb)
    Q_D(QWidget);
    d->createTLExtra();
    d->topData()->role = role;
    if (windowHandle()) {
        if (auto *xcbWindow = dynamic_cast<QXcbWindow*>(windowHandle()->handle()))
            xcbWindow->setWindowRole(role);
    }
#else
    Q_UNUSED(role);
#endif
}